

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

QToken * filter_qtoken(QToken *__return_storage_ptr__,QToken *token,uint32_t off,
                      TokenValidator *is_ok)

{
  pointer puVar1;
  QToken *pQVar2;
  char cVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  pointer puVar5;
  uint8_t val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> possible_values;
  uchar local_5e;
  uchar local_5d;
  uint32_t local_5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  QToken *local_38;
  
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_38 = __return_storage_ptr__;
  pvVar4 = QToken::possible_values(token);
  puVar5 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      local_5e = *puVar5;
      local_5d = local_5e;
      local_5c = off;
      if (*(long *)(is_ok + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      cVar3 = (**(code **)(is_ok + 0x18))(is_ok,&local_5c,&local_5d);
      if (cVar3 != '\0') {
        if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                     (iterator)
                     local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_5e);
        }
        else {
          *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish = local_5e;
          local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  pQVar2 = local_38;
  QToken::with_values(&local_58);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pQVar2;
}

Assistant:

QToken filter_qtoken(const QToken &token, uint32_t off,
                     const TokenValidator &is_ok) {
    std::vector<uint8_t> possible_values;
    for (uint8_t val : token.possible_values()) {
        if (is_ok(off, val)) {
            possible_values.push_back(val);
        }
    }
    return QToken::with_values(std::move(possible_values));
}